

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixellayout.cpp
# Opt level: O1

QRgbaFloat32 *
fetchRGB30ToRGBA32F<(QtPixelOrder)0>
          (QRgbaFloat32 *buffer,uchar *src,int index,int count,QList<unsigned_int> *param_5,
          QDitherInfo *param_6)

{
  float *pfVar1;
  uint uVar2;
  long lVar3;
  
  if (0 < count) {
    lVar3 = 0;
    do {
      uVar2 = *(uint *)(src + lVar3 + (long)index * 4);
      pfVar1 = &buffer->r + lVar3;
      *pfVar1 = (float)(uVar2 >> 0x14 & 0x3ff) * 0.0009775171;
      pfVar1[1] = (float)(uVar2 >> 10 & 0x3ff) * 0.0009775171;
      pfVar1[2] = (float)(uVar2 & 0x3ff) * 0.0009775171;
      pfVar1[3] = (float)(uVar2 >> 0x1e) * 0.33333334;
      lVar3 = lVar3 + 4;
    } while ((ulong)(uint)count << 2 != lVar3);
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchRGB30ToRGBA32F(QRgbaFloat32 *buffer, const uchar *src, int index, int count,
                                                       const QList<QRgb> *, QDitherInfo *)
{
    return convertA2RGB30PMToRGBA32F<PixelOrder>(buffer, reinterpret_cast<const uint *>(src) + index, count, nullptr, nullptr);
}